

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O1

char * lookup_name(name_cache_conflict *cache,_func_char_ptr_name_cache_ptr_id_t *lookup_fn,id_t id)

{
  char *pcVar1;
  int iVar2;
  anon_struct_16_2_515341a9 *paVar3;
  
  cache->probes = cache->probes + 1;
  iVar2 = (int)((ulong)id % cache->size);
  paVar3 = cache->cache + iVar2;
  pcVar1 = cache->cache[iVar2].name;
  if (pcVar1 != (char *)0x0) {
    if (paVar3->id == id) {
      cache->hits = cache->hits + 1;
      if (pcVar1 == "(noname)") {
        return (char *)0x0;
      }
      return pcVar1;
    }
    if (pcVar1 != "(noname)") {
      free(pcVar1);
    }
    cache->cache[iVar2].name = (char *)0x0;
  }
  pcVar1 = (*lookup_fn)(cache,id);
  if (pcVar1 == (char *)0x0) {
    cache->cache[iVar2].name = "(noname)";
    paVar3->id = id;
    pcVar1 = (char *)0x0;
  }
  else {
    cache->cache[iVar2].name = pcVar1;
    paVar3->id = id;
  }
  return pcVar1;
}

Assistant:

static const char *
lookup_name(struct name_cache *cache,
    const char * (*lookup_fn)(struct name_cache *, id_t), id_t id)
{
	const char *name;
	int slot;


	cache->probes++;

	slot = id % cache->size;
	if (cache->cache[slot].name != NULL) {
		if (cache->cache[slot].id == id) {
			cache->hits++;
			if (cache->cache[slot].name == NO_NAME)
				return (NULL);
			return (cache->cache[slot].name);
		}
		if (cache->cache[slot].name != NO_NAME)
			free((void *)(uintptr_t)cache->cache[slot].name);
		cache->cache[slot].name = NULL;
	}

	name = (lookup_fn)(cache, id);
	if (name == NULL) {
		/* Cache and return the negative response. */
		cache->cache[slot].name = NO_NAME;
		cache->cache[slot].id = id;
		return (NULL);
	}

	cache->cache[slot].name = name;
	cache->cache[slot].id = id;
	return (cache->cache[slot].name);
}